

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.c
# Opt level: O1

void do_predict(FILE *input,FILE *output)

{
  char cVar1;
  double dVar2;
  model *pmVar3;
  feature_node *pfVar4;
  FILE *__stream;
  uint uVar5;
  int iVar6;
  void *__ptr;
  void *__ptr_00;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  int *piVar10;
  ushort **ppuVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  double dVar16;
  char *endptr;
  double local_a8;
  char *local_98;
  ulong local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  FILE *local_58;
  int local_50;
  int local_4c;
  FILE *local_48;
  void *local_40;
  double local_38;
  
  local_58 = (FILE *)input;
  uVar5 = get_nr_class(model_);
  local_4c = get_nr_feature(model_);
  local_60 = 0.0;
  local_50 = (local_4c + 1) - (uint)(model_->bias < 0.0);
  uVar12 = 0;
  if (flag_predict_probability == 0) {
    __ptr_00 = (void *)0x0;
  }
  else {
    iVar6 = check_probability_model();
    if (iVar6 == 0) {
LAB_00102af6:
      do_predict_cold_1();
      puts(
          "Usage: predict [options] test_file model_file output_file\noptions:\n-b probability_estimates: whether to output probability estimates, 0 or 1 (default 0); currently for logistic regression only\n-q : quiet mode (no outputs)"
          );
      exit(1);
    }
    __ptr = malloc((long)(int)uVar5 * 4);
    get_labels(model_,__ptr);
    __ptr_00 = malloc((long)(int)uVar5 * 8);
    fwrite("labels",6,1,(FILE *)output);
    if (0 < (int)uVar5) {
      uVar13 = 0;
      do {
        fprintf((FILE *)output," %d",(ulong)*(uint *)((long)__ptr + uVar13 * 4));
        uVar13 = uVar13 + 1;
      } while (uVar5 != uVar13);
    }
    fputc(10,(FILE *)output);
    free(__ptr);
  }
  max_line_len = 0x400;
  line = (char *)malloc(0x400);
  pcVar7 = fgets(line,0x400,local_58);
  local_68 = 0.0;
  local_70 = 0.0;
  local_78 = 0.0;
  local_80 = 0.0;
  local_88 = 0.0;
  local_90 = 0;
  if (pcVar7 != (char *)0x0) {
    local_90 = 0;
    uVar12 = 0;
    local_88 = 0.0;
    local_80 = 0.0;
    local_78 = 0.0;
    local_70 = 0.0;
    local_68 = 0.0;
    local_60 = 0.0;
    local_48 = (FILE *)output;
    local_40 = __ptr_00;
LAB_00102620:
    do {
      pcVar7 = line;
      pcVar8 = strrchr(line,10);
      if (pcVar8 == (char *)0x0) {
        lVar15 = (long)max_line_len;
        iVar6 = (int)(lVar15 * 2);
        max_line_len = iVar6;
        pcVar7 = (char *)realloc(pcVar7,lVar15 * 2);
        line = pcVar7;
        sVar9 = strlen(pcVar7);
        pcVar7 = fgets(pcVar7 + (int)sVar9,iVar6 - (int)sVar9,local_58);
        if (pcVar7 != (char *)0x0) goto LAB_00102620;
      }
      if (line == (char *)0x0) break;
      pcVar7 = strtok(line," \t\n");
      if (pcVar7 == (char *)0x0) {
LAB_00102aef:
        do_predict_cold_5();
        goto LAB_00102af6;
      }
      dVar2 = strtod(pcVar7,&local_98);
      if ((local_98 == pcVar7) || (*local_98 != '\0')) {
LAB_00102ae5:
        do_predict_cold_4();
        goto LAB_00102aef;
      }
      uVar5 = 0;
      iVar6 = 0;
      local_38 = dVar2;
      while( true ) {
        lVar15 = (long)max_nr_attr;
        if (max_nr_attr + -2 <= (int)uVar5) {
          max_nr_attr = max_nr_attr * 2;
          x = (feature_node *)realloc(x,lVar15 << 5);
        }
        pcVar7 = strtok((char *)0x0,":");
        pcVar8 = strtok((char *)0x0," \t");
        __ptr_00 = local_40;
        __stream = local_48;
        pfVar4 = x;
        pmVar3 = model_;
        if (pcVar8 == (char *)0x0) break;
        piVar10 = __errno_location();
        *piVar10 = 0;
        lVar15 = strtol(pcVar7,&local_98,10);
        iVar14 = (int)lVar15;
        x[uVar5].index = iVar14;
        if ((((local_98 == pcVar7) || (*piVar10 != 0)) || (*local_98 != '\0')) || (iVar14 <= iVar6))
        {
          do_predict_cold_3();
LAB_00102adb:
          do_predict_cold_2();
          goto LAB_00102ae5;
        }
        *piVar10 = 0;
        dVar2 = strtod(pcVar8,&local_98);
        pfVar4 = x;
        x[uVar5].value = dVar2;
        if ((local_98 == pcVar8) || (*piVar10 != 0)) goto LAB_00102adb;
        cVar1 = *local_98;
        if ((long)cVar1 != 0) {
          ppuVar11 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar11 + (long)cVar1 * 2 + 1) & 0x20) == 0) goto LAB_00102adb;
        }
        uVar5 = uVar5 + (pfVar4[uVar5].index <= local_4c);
        iVar6 = iVar14;
      }
      dVar2 = model_->bias;
      if (0.0 <= dVar2) {
        x[uVar5].index = local_50;
        pfVar4[uVar5].value = dVar2;
        uVar5 = uVar5 + 1;
      }
      pfVar4 = x;
      x[(int)uVar5].index = -1;
      if (flag_predict_probability == 0) {
        local_a8 = (double)predict();
        fprintf(__stream,"%g\n");
        __ptr_00 = local_40;
      }
      else {
        local_a8 = (double)predict_probability(pmVar3,pfVar4,local_40);
        fprintf(__stream,"%g");
        if (0 < model_->nr_class) {
          lVar15 = 0;
          do {
            fprintf(__stream," %g",(int)*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
            lVar15 = lVar15 + 1;
          } while (lVar15 < model_->nr_class);
        }
        fputc(10,__stream);
      }
      local_90 = (ulong)((int)local_90 + (uint)(local_a8 == local_38));
      local_88 = local_88 + (local_a8 - local_38) * (local_a8 - local_38);
      local_80 = local_80 + local_a8;
      local_78 = local_78 + local_38;
      local_70 = local_70 + local_a8 * local_a8;
      local_68 = local_68 + local_38 * local_38;
      local_60 = local_60 + local_a8 * local_38;
      uVar12 = (ulong)((int)uVar12 + 1);
      pcVar7 = fgets(line,max_line_len,local_58);
    } while (pcVar7 != (char *)0x0);
  }
  iVar6 = check_regression_model(model_);
  if (iVar6 == 0) {
    (*info)("Accuracy = %g%% (%d/%d)\n",
            SUB84(((double)(int)local_90 / (double)(int)uVar12) * 100.0,0),local_90,uVar12);
  }
  else {
    dVar16 = (double)(int)uVar12;
    (*info)("Mean squared error = %g (regression)\n",SUB84(local_88 / dVar16,0));
    dVar2 = local_60 * dVar16 - local_78 * local_80;
    (*info)("Squared correlation coefficient = %g (regression)\n",
            SUB84((dVar2 * dVar2) /
                  ((local_68 * dVar16 - local_78 * local_78) *
                  (local_70 * dVar16 - local_80 * local_80)),0));
  }
  if (flag_predict_probability != 0) {
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

void do_predict(FILE *input, FILE *output)
{
	int correct = 0;
	int total = 0;
	double error = 0;
	double sump = 0, sumt = 0, sumpp = 0, sumtt = 0, sumpt = 0;

	int nr_class=get_nr_class(model_);
	double *prob_estimates=NULL;
	int j, n;
	int nr_feature=get_nr_feature(model_);
	if(model_->bias>=0)
		n=nr_feature+1;
	else
		n=nr_feature;

	if(flag_predict_probability)
	{
		int *labels;

		if(!check_probability_model(model_))
		{
			fprintf(stderr, "probability output is only supported for logistic regression\n");
			exit(1);
		}

		labels=(int *) malloc(nr_class*sizeof(int));
		get_labels(model_,labels);
		prob_estimates = (double *) malloc(nr_class*sizeof(double));
		fprintf(output,"labels");
		for(j=0;j<nr_class;j++)
			fprintf(output," %d",labels[j]);
		fprintf(output,"\n");
		free(labels);
	}

	max_line_len = 1024;
	line = (char *)malloc(max_line_len*sizeof(char));
	while(readline(input) != NULL)
	{
		int i = 0;
		double target_label, predict_label;
		char *idx, *val, *label, *endptr;
		int inst_max_index = 0; // strtol gives 0 if wrong format

		label = strtok(line," \t\n");
		if(label == NULL) // empty line
			exit_input_error(total+1);

		target_label = strtod(label,&endptr);
		if(endptr == label || *endptr != '\0')
			exit_input_error(total+1);

		while(1)
		{
			if(i>=max_nr_attr-2)	// need one more for index = -1
			{
				max_nr_attr *= 2;
				x = (struct feature_node *) realloc(x,max_nr_attr*sizeof(struct feature_node));
			}

			idx = strtok(NULL,":");
			val = strtok(NULL," \t");

			if(val == NULL)
				break;
			errno = 0;
			x[i].index = (int) strtol(idx,&endptr,10);
			if(endptr == idx || errno != 0 || *endptr != '\0' || x[i].index <= inst_max_index)
				exit_input_error(total+1);
			else
				inst_max_index = x[i].index;

			errno = 0;
			x[i].value = strtod(val,&endptr);
			if(endptr == val || errno != 0 || (*endptr != '\0' && !isspace(*endptr)))
				exit_input_error(total+1);

			// feature indices larger than those in training are not used
			if(x[i].index <= nr_feature)
				++i;
		}

		if(model_->bias>=0)
		{
			x[i].index = n;
			x[i].value = model_->bias;
			i++;
		}
		x[i].index = -1;

		if(flag_predict_probability)
		{
			int j;
			predict_label = predict_probability(model_,x,prob_estimates);
			fprintf(output,"%g",predict_label);
			for(j=0;j<model_->nr_class;j++)
				fprintf(output," %g",prob_estimates[j]);
			fprintf(output,"\n");
		}
		else
		{
			predict_label = predict(model_,x);
			fprintf(output,"%g\n",predict_label);
		}

		if(predict_label == target_label)
			++correct;
		error += (predict_label-target_label)*(predict_label-target_label);
		sump += predict_label;
		sumt += target_label;
		sumpp += predict_label*predict_label;
		sumtt += target_label*target_label;
		sumpt += predict_label*target_label;
		++total;
	}
	if(check_regression_model(model_))
	{
		info("Mean squared error = %g (regression)\n",error/total);
		info("Squared correlation coefficient = %g (regression)\n",
			((total*sumpt-sump*sumt)*(total*sumpt-sump*sumt))/
			((total*sumpp-sump*sump)*(total*sumtt-sumt*sumt))
			);
	}
	else
		info("Accuracy = %g%% (%d/%d)\n",(double) correct/total*100,correct,total);
	if(flag_predict_probability)
		free(prob_estimates);
}